

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O0

void __thiscall WrapperCommand::execute(WrapperCommand *this,CmdParams *params,CmdContext *context)

{
  long lVar1;
  ostream *this_00;
  ExeElementWrapper *wrapper;
  allocator<char> local_51;
  string local_50;
  size_t local_30;
  size_t wrId;
  MappedExe *mappedExe;
  CmdContext *context_local;
  CmdParams *params_local;
  WrapperCommand *this_local;
  
  mappedExe = (MappedExe *)context;
  context_local = (CmdContext *)params;
  params_local = (CmdParams *)this;
  wrId = (size_t)cmd_util::getMappedExeFromContext(context);
  if ((MappedExe *)wrId != (MappedExe *)0x0) {
    local_30 = this->wrapperId;
    if (local_30 == 0xffffffffffffffff) {
      cmd_util::printWrapperNames((MappedExe *)wrId);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"wrapperNum",&local_51)
      ;
      local_30 = cmd_util::readNumber(&local_50,false);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
    lVar1 = (**(code **)(*(long *)(wrId + 0x18) + 0x10))(wrId + 0x18,local_30);
    if (lVar1 == 0) {
      this_00 = std::operator<<((ostream *)&std::cout,"No such wrapper!");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    else {
      (*(this->super_Command)._vptr_Command[5])(this,lVar1);
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        MappedExe *mappedExe = cmd_util::getMappedExeFromContext(context);
        if (mappedExe == NULL) return;

        size_t wrId = wrapperId;
        if (wrId == INVALID_WRAPPER) {
            cmd_util::printWrapperNames(mappedExe);
            wrId = cmd_util::readNumber("wrapperNum", false);
        }
        ExeElementWrapper *wrapper = mappedExe->getWrapper(wrId);
        if (wrapper == NULL) {
            std::cout << "No such wrapper!" << std::endl;
            return;
        }
        wrapperAction(wrapper);
    }